

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O2

void __thiscall TreeWalker::acceptButtonGroups(TreeWalker *this,DomButtonGroups *domButtonGroups)

{
  DomButtonGroup **ppDVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<DomButtonGroup_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (domButtonGroups->m_buttonGroup).d.d;
  ppDVar1 = (domButtonGroups->m_buttonGroup).d.ptr;
  local_40.size = (domButtonGroups->m_buttonGroup).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar3 = local_40.size * 8;
  local_40.ptr = ppDVar1;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    (*this->_vptr_TreeWalker[0x22])(this,*(undefined8 *)((long)ppDVar1 + lVar2));
  }
  QArrayDataPointer<DomButtonGroup_*>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TreeWalker::acceptButtonGroups(const DomButtonGroups *domButtonGroups)
{
    const auto &domGroups = domButtonGroups->elementButtonGroup();
    for (const DomButtonGroup *g : domGroups)
        acceptButtonGroup(g);
}